

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator%(long lhs,SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> u;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  char local_11;
  long local_10;
  
  local_11 = '\0';
  local_10 = lhs;
  u = SafeInt<long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
                ((SafeInt<long,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_10,
                 rhs.m_int);
  SafeCastHelper<char,_long,_4>::CastThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (u.m_int,&local_11);
  return (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_11;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator %( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Value of return depends on sign of lhs
    // This one may not be safe - bounds check in constructor
    // if lhs is negative and rhs is unsigned, this will throw an exception.

    // Fast-track the simple case
    // same size and same sign
    SafeInt< T, E > result;

    if( ModulusSimpleCaseHelper< T, U, E, (sizeof(T) == sizeof(U)) && ((bool)std::numeric_limits< T >::is_signed == (bool)std::numeric_limits< U >::is_signed) >::ModulusSimpleCase( lhs, rhs, result ) )
        return result;

    result = (SafeInt< U, E >(lhs) % (T)rhs);
    return result;
}